

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CounterUnitTest.cpp
# Opt level: O0

bool TestIncrement(void)

{
  bool bVar1;
  undefined1 local_9;
  
  bVar1 = TestIncrementF<Counter<unsigned_long,64u>>();
  if (bVar1) {
    bVar1 = TestIncrementF<Counter<unsigned_long,48u>>();
    if (bVar1) {
      bVar1 = TestIncrementF<Counter<unsigned_int,32u>>();
      if (bVar1) {
        bVar1 = TestIncrementF<Counter<unsigned_int,24u>>();
        if (bVar1) {
          bVar1 = TestIncrementF<Counter<unsigned_short,16u>>();
          if (bVar1) {
            bVar1 = TestIncrementF<Counter<unsigned_short,10u>>();
            if (bVar1) {
              bVar1 = TestIncrementF<Counter<unsigned_char,8u>>();
              if (bVar1) {
                bVar1 = TestIncrementF<Counter<unsigned_char,4u>>();
                if (bVar1) {
                  local_9 = true;
                }
                else {
                  local_9 = false;
                }
              }
              else {
                local_9 = false;
              }
            }
            else {
              local_9 = false;
            }
          }
          else {
            local_9 = false;
          }
        }
        else {
          local_9 = false;
        }
      }
      else {
        local_9 = false;
      }
    }
    else {
      local_9 = false;
    }
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

bool TestIncrement()
{
    TEST_CHECK(TestIncrementF<Counter64>());
    TEST_CHECK(TestIncrementF<Counter48>());
    TEST_CHECK(TestIncrementF<Counter32>());
    TEST_CHECK(TestIncrementF<Counter24>());
    TEST_CHECK(TestIncrementF<Counter16>());
    TEST_CHECK(TestIncrementF<Counter10>());
    TEST_CHECK(TestIncrementF<Counter8>());
    TEST_CHECK(TestIncrementF<Counter4>());
    return true;
}